

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex_base.h
# Opt level: O2

void __thiscall
alex::ExpectedShiftsAccumulator::accumulate
          (ExpectedShiftsAccumulator *this,int actual_position,int param_3)

{
  int iVar1;
  long lVar2;
  
  iVar1 = this->last_position_ + 1;
  if (iVar1 < actual_position) {
    lVar2 = (long)(iVar1 - this->dense_region_start_idx_);
    this->num_expected_shifts_ = this->num_expected_shifts_ + ((ulong)(lVar2 * lVar2) >> 2);
    this->dense_region_start_idx_ = actual_position;
  }
  this->last_position_ = actual_position;
  this->count_ = this->count_ + 1;
  return;
}

Assistant:

void accumulate(int actual_position, int) override {
    if (actual_position > last_position_ + 1) {
      long long dense_region_length = last_position_ - dense_region_start_idx_ + 1;
      num_expected_shifts_ += (dense_region_length * dense_region_length) / 4;
      dense_region_start_idx_ = actual_position;
    }
    last_position_ = actual_position;
    count_++;
  }